

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc_length_parameterized_bezier.cpp
# Opt level: O0

int main(void)

{
  Scalar_ *this;
  double dVar1;
  bool bVar2;
  Scalar *pSVar3;
  _InputArray local_458;
  allocator<char> local_439;
  string local_438 [32];
  Scalar_<double> local_418;
  Point_<int> local_3f8;
  _InputOutputArray local_3f0;
  DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *local_3d8;
  Matrix<double,_2,_1,_0,_2,_1> *p;
  iterator __end1;
  iterator __begin1;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_3b8;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  *local_3a0;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  *__range1;
  Point_<int> local_378;
  Point_<int> local_370;
  _InputOutputArray local_368;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_350 [16];
  Scalar_<double> local_340;
  Point_<int> local_320;
  _InputOutputArray local_318;
  undefined4 local_300;
  int local_2fc;
  undefined1 local_2f8 [8];
  PointType ps4_1;
  _InputArray local_2c8;
  _InputOutputArray local_2b0;
  int local_298;
  int local_294;
  undefined8 local_290;
  undefined1 local_288 [8];
  PointType ps4;
  double step;
  double t;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> vec;
  int local_240 [2];
  undefined1 local_238 [8];
  Vector2d prev_point;
  Mat local_208 [8];
  Mat img;
  int local_1a8 [8];
  Matrix<double,2,1,0,2,1> local_188 [16];
  Matrix<double,2,1,0,2,1> local_178 [16];
  Matrix<double,2,1,0,2,1> local_168 [16];
  Matrix<double,2,1,0,2,1> local_158 [16];
  initializer_list<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_148;
  undefined1 local_138 [8];
  Bezier<3,_2> bezier;
  
  local_1a8[7] = 100;
  local_1a8[6] = 200;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_188,local_1a8 + 7,local_1a8 + 6);
  local_1a8[5] = 400;
  local_1a8[4] = 100;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_178,local_1a8 + 5,local_1a8 + 4);
  local_1a8[3] = 0x140;
  local_1a8[2] = 300;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_168,local_1a8 + 3,local_1a8 + 2);
  local_1a8[1] = 600;
  local_1a8[0] = 400;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_158,local_1a8 + 1,local_1a8);
  local_148._M_len = 4;
  local_148._M_array = (iterator)local_188;
  Bezier<3,_2>::Bezier((Bezier<3,_2> *)local_138,&local_148);
  this = (Scalar_ *)
         (prev_point.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
          array + 1);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)this,0.0);
  cv::Mat::Mat(local_208,500,700,0x10,this);
  local_240[1] = 0;
  local_240[0] = 0;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>
            ((Matrix<double,2,1,0,2,1> *)local_238,local_240 + 1,local_240);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&t);
  ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] = 0.01;
  for (step = 0.0; step <= 1.0;
      step = ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
             [1] + step) {
    local_290._4_4_ = 0;
    local_290._0_4_ = 4;
    Curve<3,_2>::atWithArcLengthParameterized
              ((Curve<3,_2> *)local_288,(double *)local_138,(int *)&step,
               (int *)((long)&local_290 + 4),(double *)&local_290);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)local_288,0);
    local_294 = (int)*pSVar3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)local_288,1);
    local_298 = (int)*pSVar3;
    std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<int,int>
              ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&t,&local_294,&local_298);
  }
  cv::_InputOutputArray::_InputOutputArray(&local_2b0,local_208);
  cv::_InputArray::_InputArray<cv::Point_<int>>
            (&local_2c8,(vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&t);
  cv::Scalar_<double>::Scalar_
            ((Scalar_<double> *)
             (ps4_1.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
              array + 1),0.0,0.0,255.0,0.0);
  cv::polylines(&local_2b0,&local_2c8,false,
                (Scalar_ *)
                (ps4_1.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data
                 .array + 1),1,0x10,0);
  cv::_InputArray::~_InputArray(&local_2c8);
  cv::_InputOutputArray::~_InputOutputArray(&local_2b0);
  ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] = 0.25;
  for (step = 0.0; step <= 1.0;
      step = ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
             [1] + step) {
    local_2fc = 0;
    local_300 = 4;
    Curve<3,_2>::atWithArcLengthParameterized
              ((Curve<3,_2> *)local_2f8,(double *)local_138,(int *)&step,&local_2fc,
               (double *)&local_300);
    cv::_InputOutputArray::_InputOutputArray(&local_318,local_208);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)local_2f8,0);
    dVar1 = *pSVar3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)local_2f8,1);
    cv::Point_<int>::Point_(&local_320,(int)dVar1,(int)*pSVar3);
    cv::Scalar_<double>::Scalar_(&local_340,0.0,255.0,0.0,0.0);
    cv::circle(&local_318,&local_320,4,&local_340,0xffffffff,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_318);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
    bVar2 = Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator!=
                      ((MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_238,local_350);
    if (bVar2) {
      cv::_InputOutputArray::_InputOutputArray(&local_368,local_208);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)local_238,0);
      dVar1 = *pSVar3;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)local_238,1);
      cv::Point_<int>::Point_(&local_370,(int)dVar1,(int)*pSVar3);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)local_2f8,0);
      dVar1 = *pSVar3;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)local_2f8,1);
      cv::Point_<int>::Point_(&local_378,(int)dVar1,(int)*pSVar3);
      cv::Scalar_<double>::Scalar_((Scalar_<double> *)&__range1,255.0,255.0,255.0,0.0);
      cv::line(&local_368,&local_370,&local_378,&__range1,1,0x10,0);
      cv::_InputOutputArray::~_InputOutputArray(&local_368);
    }
    Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=
              ((Matrix<double,_2,_1,_0,_2,_1> *)local_238,(Matrix<double,_2,_1,_0,_2,_1> *)local_2f8
              );
  }
  __begin1._M_current._4_4_ = 4;
  Curve<3,_2>::sampleWithArcLengthParameterized
            (&local_3b8,(Curve<3,_2> *)local_138,
             ps4.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
             + 1,false,(int *)((long)&__begin1._M_current + 4),
             (vector<double,_std::allocator<double>_> *)0x0);
  local_3a0 = &local_3b8;
  __end1 = std::
           vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
           ::begin(local_3a0);
  p = (Matrix<double,_2,_1,_0,_2,_1> *)
      std::
      vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
      ::end(local_3a0);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_*,_std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                                     *)&p), bVar2) {
    local_3d8 = (DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)
                __gnu_cxx::
                __normal_iterator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_*,_std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
                ::operator*(&__end1);
    cv::_InputOutputArray::_InputOutputArray(&local_3f0,local_208);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       (local_3d8,0);
    dVar1 = *pSVar3;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       (local_3d8,1);
    cv::Point_<int>::Point_(&local_3f8,(int)dVar1,(int)*pSVar3);
    cv::Scalar_<double>::Scalar_(&local_418,255.0,0.0,0.0,0.0);
    cv::circle(&local_3f0,&local_3f8,2,&local_418,0xffffffff,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_3f0);
    __gnu_cxx::
    __normal_iterator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_*,_std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  ::~vector(&local_3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_438,"arc-length parameterized of bezier curve",&local_439);
  cv::_InputArray::_InputArray(&local_458,local_208);
  cv::imshow(local_438,&local_458);
  cv::_InputArray::~_InputArray(&local_458);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator(&local_439);
  cv::waitKey(0);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&t);
  cv::Mat::~Mat(local_208);
  return 0;
}

Assistant:

int main() {
  // define a bezier
  Bezier bezier{{100, 200}, {400, 100}, {320, 300}, {600, 400}};

  Mat img(500, 700, CV_8UC3, Scalar(0));

  Eigen::Vector2d prev_point{0, 0};
  vector<Point> vec;

  // draw curve
  double t = 0.0, step = 0.01;
  while (t <= 1.0) {
    auto ps4 = bezier.atWithArcLengthParameterized(t, 0, 4);
    vec.emplace_back(int(ps4[0]), int(ps4[1]));
    t += step;
  }
  polylines(img, vec, false, {0, 0, 255}, 1, LINE_AA);

  // draw equal arc distance point
  t = 0, step = 0.25;
  while (t <= 1.0) {
    auto ps4 = bezier.atWithArcLengthParameterized(t, 0, 4);
    circle(img, {int(ps4[0]), int(ps4[1])}, 4, {0, 255, 0}, -1);
    if (prev_point != Eigen::Vector2d::Zero()) {
      line(img,
           {int(prev_point[0]), int(prev_point[1])},
           {int(ps4[0]), int(ps4[1])},
           {255, 255, 255},
           1,
           LINE_AA);
    }
    prev_point = ps4;
    t += step;
  }

  for (auto& p : bezier.sampleWithArcLengthParameterized(step, false, 4)) {
    circle(img, {int(p[0]), int(p[1])}, 2, {255, 0, 0}, -1);
  }

  imshow("arc-length parameterized of bezier curve", img);
  waitKey(0);

  return 0;
}